

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O1

void __thiscall cmComputeComponentGraph::TransferEdges(cmComputeComponentGraph *this)

{
  int iVar1;
  pointer pcVar2;
  pointer pcVar3;
  uint uVar4;
  cmGraphEdge *ni;
  pointer pcVar5;
  ulong uVar6;
  int j_component;
  bool local_41;
  ulong local_40;
  int local_34;
  
  uVar4 = (int)((long)(this->InputGraph->
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->InputGraph->
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x55555555;
  if (0 < (int)uVar4) {
    local_40 = (ulong)(uVar4 & 0x7fffffff);
    uVar6 = 0;
    do {
      pcVar2 = (this->InputGraph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar5 = *(pointer *)&pcVar2[uVar6].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
      pcVar3 = *(pointer *)((long)(pcVar2 + uVar6) + 8);
      if (pcVar5 != pcVar3) {
        iVar1 = (this->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6];
        do {
          local_34 = (this->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[pcVar5->Dest];
          if (iVar1 != local_34) {
            local_41 = pcVar5->Strong;
            std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
            emplace_back<int&,bool,cmListFileBacktrace_const&>
                      ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                       ((this->ComponentGraph).
                        super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                        super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                        _M_impl.super__Vector_impl_data._M_start + iVar1),&local_34,&local_41,
                       &pcVar5->Backtrace);
          }
          pcVar5 = pcVar5 + 1;
        } while (pcVar5 != pcVar3);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != local_40);
  }
  return;
}

Assistant:

void cmComputeComponentGraph::TransferEdges()
{
  // Map inter-component edges in the original graph to edges in the
  // component graph.
  int n = static_cast<int>(this->InputGraph.size());
  for (int i = 0; i < n; ++i) {
    int i_component = this->TarjanComponents[i];
    EdgeList const& nl = this->InputGraph[i];
    for (cmGraphEdge const& ni : nl) {
      int j = ni;
      int j_component = this->TarjanComponents[j];
      if (i_component != j_component) {
        // We do not attempt to combine duplicate edges, but instead
        // store the inter-component edges with suitable multiplicity.
        this->ComponentGraph[i_component].emplace_back(
          j_component, ni.IsStrong(), ni.GetBacktrace());
      }
    }
  }
}